

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

ALLEGRO_FS_INTERFACE * al_get_fs_interface(void)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  lVar2 = *plVar1;
  if (lVar2 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
    lVar2 = *plVar1;
    if (lVar2 == 0) goto LAB_00160afd;
  }
  if (*(ALLEGRO_FS_INTERFACE **)(lVar2 + 0x118) != (ALLEGRO_FS_INTERFACE *)0x0) {
    return *(ALLEGRO_FS_INTERFACE **)(lVar2 + 0x118);
  }
LAB_00160afd:
  return &_al_fs_interface_stdio;
}

Assistant:

const ALLEGRO_FS_INTERFACE *al_get_fs_interface(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return &_al_fs_interface_stdio;

   if (tls->fs_interface)
      return tls->fs_interface;
   else
      return &_al_fs_interface_stdio;
}